

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

void __thiscall icu_63::ICUService::reset(ICUService *this)

{
  Mutex local_18;
  Mutex mutex;
  ICUService *this_local;
  
  mutex.fMutex = (UMutex *)this;
  Mutex::Mutex(&local_18,(UMutex *)icu_63::lock);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x10])();
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])();
  Mutex::~Mutex(&local_18);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])();
  return;
}

Assistant:

void 
ICUService::reset() 
{
    {
        Mutex mutex(&lock);
        reInitializeFactories();
        clearCaches();
    }
    notifyChanged();
}